

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall Matrix<int>::Matrix(Matrix<int> *this,int a,int b)

{
  int **ppiVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->n = a;
  this->m = b;
  uVar5 = (long)a * 8;
  if (a < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppiVar1 = (int **)operator_new__(uVar5);
  this->M = ppiVar1;
  if (0 < a) {
    uVar5 = (long)b << 2;
    if (b < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    uVar6 = 0;
    do {
      piVar2 = (int *)operator_new__(uVar5);
      this->M[uVar6] = piVar2;
      uVar6 = uVar6 + 1;
    } while ((uint)a != uVar6);
  }
  if (0 < this->n) {
    ppiVar1 = this->M;
    lVar3 = 0;
    do {
      if (0 < this->m) {
        piVar2 = ppiVar1[lVar3];
        lVar4 = 0;
        do {
          piVar2[lVar4] = 0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->m);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->n);
  }
  return;
}

Assistant:

Matrix(int a, int b) {
    n = a;
    m = b;
    M = new T*[n];
    for (int i = 0; i < n; i++) {
      M[i] = new T[m];
    }
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        M[i][j] = 0;
      }
    }
  }